

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O1

istream * shadow::serialization_detail::serialization_type_selector<bool,_void>::
          deserialize_dispatch(istream *in,any *value)

{
  int iVar1;
  holder_base *phVar2;
  bool bVar3;
  string boolstring;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  std::operator>>(in,(string *)&local_68);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"true","");
  if (local_60 == local_40) {
    if (local_60 == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(local_68,local_48,local_60);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  phVar2 = (holder_base *)((long)&value->field_1 + 8);
  if (value->on_heap_ != false) {
    phVar2 = (value->field_1).heap + 1;
  }
  *(bool *)&phVar2->_vptr_holder_base = bVar3;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return in;
}

Assistant:

static std::istream&
    deserialize_dispatch(std::istream& in, any& value)
    {
        std::string boolstring;

        in >> boolstring;

        if(boolstring == std::string("true"))
        {
            value.get<bool>() = true;
        }
        else
        {
            value.get<bool>() = false;
        }

        return in;
    }